

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O2

string * __thiscall
OpenMPAffinityClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPAffinityClause *this)

{
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
  *this_00;
  bool bVar1;
  reference ppvVar2;
  reference ppcVar3;
  uint uVar4;
  ulong __n;
  allocator<char> local_79;
  string *local_78;
  string clause_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"affinity ",(allocator<char> *)&clause_string);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&clause_string,"(",(allocator<char> *)&local_50);
  if (this->modifier == OMPC_AFFINITY_MODIFIER_iterator) {
    std::__cxx11::string::append((char *)&clause_string);
    std::__cxx11::string::append((char *)&clause_string);
    this_00 = &this->iterators_definition_class;
    for (uVar4 = 0; __n = (ulong)uVar4,
        __n < (ulong)((long)(this->iterators_definition_class).
                            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->iterators_definition_class).
                            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
      ppvVar2 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(this_00,__n);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar2,0);
      std::__cxx11::string::append((char *)&clause_string);
      ppvVar2 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(this_00,__n);
      ppcVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar2,0);
      if (**ppcVar3 != '\0') {
        std::__cxx11::string::append((char *)&clause_string);
      }
      ppvVar2 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(this_00,__n);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar2,1);
      std::__cxx11::string::append((char *)&clause_string);
      std::__cxx11::string::append((char *)&clause_string);
      ppvVar2 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(this_00,__n);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar2,2);
      std::__cxx11::string::append((char *)&clause_string);
      std::__cxx11::string::append((char *)&clause_string);
      ppvVar2 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(this_00,__n);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar2,3);
      std::__cxx11::string::append((char *)&clause_string);
      ppvVar2 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(this_00,__n);
      ppcVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar2,4);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,*ppcVar3,&local_79);
      bVar1 = std::operator!=(&local_50,"");
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar1) {
        std::__cxx11::string::append((char *)&clause_string);
        ppvVar2 = std::
                  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                  ::at(this_00,__n);
        std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar2,4);
        std::__cxx11::string::append((char *)&clause_string);
      }
      std::__cxx11::string::append((char *)&clause_string);
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&clause_string);
    std::__cxx11::string::operator=((string *)&clause_string,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((char *)&clause_string);
  }
  if (1 < clause_string._M_string_length) {
    std::__cxx11::string::append((char *)&clause_string);
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_50,&this->super_OpenMPClause);
  std::__cxx11::string::append((string *)&clause_string);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)&clause_string);
  if (3 < clause_string._M_string_length) {
    std::__cxx11::string::append((string *)local_78);
  }
  std::__cxx11::string::~string((string *)&clause_string);
  return local_78;
}

Assistant:

std::string OpenMPAffinityClause::toString() {
    std::vector<vector<const char*>* >* iterators_definition_class = this->getIteratorsDefinitionClass();
    std::string result = "affinity ";
    std::string clause_string = "(";
    OpenMPAffinityClauseModifier modifier = this->getModifier();
    switch (modifier) {
        case OMPC_AFFINITY_MODIFIER_iterator:
            clause_string += "iterator";
            clause_string += " ( ";
            for (unsigned int i = 0; i <iterators_definition_class->size(); i++){
                clause_string += iterators_definition_class->at(i)->at(0);
                if (strcmp(iterators_definition_class->at(i)->at(0), "\0") != 0) { clause_string +=" "; };
                clause_string +=iterators_definition_class->at(i)->at(1);
                clause_string +="=";
                clause_string +=iterators_definition_class->at(i)->at(2);
                clause_string +=":";
                clause_string +=iterators_definition_class->at(i)->at(3);
                if ((string)iterators_definition_class->at(i)->at(4) != "") {
                    clause_string +=":";clause_string +=iterators_definition_class->at(i)->at(4);
                }
                clause_string += ", ";
            };
            clause_string = clause_string.substr(0, clause_string.size()-2);
            clause_string += " )";
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += " : ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}